

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

uint32_t predict_sup_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_40,&data->cumulative_costs);
  uVar1 = find_min<float>((vector<float,_std::allocator<float>_> *)&local_40);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  uVar1 = predict_sublearner_adf(data,base,ec,uVar1);
  return uVar1;
}

Assistant:

uint32_t predict_sup_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);
	return predict_sublearner_adf(data, base, ec, argmin);
}